

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O1

CVmUndoMeta * __thiscall CVmUndo::alloc_rec(CVmUndo *this)

{
  uint uVar1;
  CVmUndoMeta *pCVar2;
  CVmUndoMeta *pCVar3;
  
  uVar1 = this->savept_cnt_;
  while ((uVar1 != 0 && (this->next_free_ == this->oldest_first_))) {
    drop_oldest_savept(this);
    if (uVar1 == 1) {
      return (CVmUndoMeta *)0x0;
    }
    uVar1 = this->savept_cnt_;
  }
  pCVar2 = this->next_free_;
  pCVar3 = pCVar2 + 1;
  if (pCVar3 == this->rec_arr_ + this->rec_arr_size_) {
    pCVar3 = this->rec_arr_;
  }
  this->next_free_ = pCVar3;
  return pCVar2;
}

Assistant:

CVmUndoMeta *CVmUndo::alloc_rec(VMG0_)
{
    /* 
     *   keep trying until we find an entry or run out of savepoints to
     *   delete 
     */
    for (;;)
    {
        /*
         *   If we have no savepoints at all, all records are free.
         *   Otherwise, if the next free pointer hasn't bumped up against
         *   the oldest allocated record yet, we can allocate another
         *   record.  
         */
        if (savept_cnt_ == 0 || next_free_ != oldest_first_)
        {
            CVmUndoMeta *ret;
            
            /* remember the current free record */
            ret = next_free_;

            /* 
             *   advance to the next record, wrapping if we reach the end
             *   of the array (since we treat the array as circular) 
             */
            inc_rec_ptr(&next_free_);

            /* return the record */
            return ret;
        }
        
        /* 
         *   If we have at least one old savepoint, discard the oldest
         *   savepoint, which may free up some records, and try again;
         *   otherwise, give up.  
         */
        if (savept_cnt_ > 1)
        {
            /* 
             *   we have at least one old savepoint we can discard - get
             *   rid of it and try again 
             */
            drop_oldest_savept(vmg0_);
        }
        else
        {
            /* 
             *   we are down to our last savepoint (or none at all) - it's
             *   no longer valid (since we can't keep it complete due to
             *   the lack of available records), so delete it and return
             *   failure 
             */
            drop_oldest_savept(vmg0_);
            return 0;
        }
    }
}